

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memcpy.c
# Opt level: O3

ssize_t mpt_memcpy(ssize_t len,iovec *src,size_t nsrc,iovec *dest,size_t ndest)

{
  long lVar1;
  size_t *psVar2;
  void *__dest;
  size_t sVar3;
  void *__src;
  size_t sVar4;
  size_t sVar5;
  ssize_t sVar6;
  ulong __n;
  size_t local_58;
  iovec *local_50;
  iovec *local_48;
  
  if (nsrc != 0 && ndest != 0) {
    __src = src->iov_base;
    sVar5 = src->iov_len;
    __dest = dest->iov_base;
    sVar3 = dest->iov_len;
    if (0 < len) {
      sVar4 = sVar5;
      if (1 < nsrc) {
        lVar1 = nsrc - 1;
        psVar2 = &src[1].iov_len;
        do {
          sVar4 = sVar4 + *psVar2;
          psVar2 = psVar2 + 2;
          lVar1 = lVar1 + -1;
        } while (lVar1 != 0);
      }
      if ((long)sVar4 < len) {
        return -1;
      }
      sVar4 = sVar3;
      if (1 < ndest) {
        lVar1 = ndest - 1;
        psVar2 = &dest[1].iov_len;
        do {
          sVar4 = sVar4 + *psVar2;
          psVar2 = psVar2 + 2;
          lVar1 = lVar1 + -1;
        } while (lVar1 != 0);
      }
      if ((long)sVar4 < len) {
        return -2;
      }
    }
    if (len != 0) {
      sVar6 = 0;
      local_58 = ndest;
      local_50 = dest;
      local_48 = src;
      do {
        if (sVar5 == 0) {
          nsrc = nsrc - 1;
          if (nsrc == 0) {
            return sVar6;
          }
          __src = local_48[1].iov_base;
          sVar5 = local_48[1].iov_len;
          local_48 = local_48 + 1;
        }
        else if (sVar3 == 0) {
          local_58 = local_58 - 1;
          if (local_58 == 0) {
            return sVar6;
          }
          __dest = local_50[1].iov_base;
          sVar3 = local_50[1].iov_len;
          local_50 = local_50 + 1;
        }
        else {
          __n = len;
          if (sVar5 < (ulong)len) {
            __n = sVar5;
          }
          if (sVar3 < __n) {
            __n = sVar3;
          }
          memcpy(__dest,__src,__n);
          __src = (void *)((long)__src + __n);
          sVar5 = sVar5 - __n;
          __dest = (void *)((long)__dest + __n);
          sVar3 = sVar3 - __n;
          sVar6 = sVar6 + __n;
          len = len - __n;
        }
      } while (len != 0);
      return sVar6;
    }
  }
  return 0;
}

Assistant:

extern ssize_t mpt_memcpy(ssize_t len,
			  const struct iovec *src,  size_t nsrc,
			  const struct iovec *dest, size_t ndest)
{
	int8_t	*source, *target;
	size_t	total = 0, left, space;
	
	if (!ndest || !nsrc)
		return 0;
	
	source = src->iov_base;
	left   = src->iov_len;
	
	target = dest->iov_base;
	space  = dest->iov_len;
	
	/* check maximum size */
	if (len > 0) {
		size_t pos;
		for (total = left,  pos = 1; pos < nsrc;  ++pos) total += src[pos].iov_len;
		if (len > (ssize_t) total) return -1;
		for (total = space, pos = 1; pos < ndest; ++pos) total += dest[pos].iov_len;
		if (len > (ssize_t) total) return -2;
	}
	total = 0;
	
	while (len) {
		size_t copy = len;
		if (!left) {
			if (!(--nsrc)) break;
			++src;
			source = src->iov_base;
			left   = src->iov_len;
			continue;
		}
		if (!space) {
			if (!(--ndest)) break;
			++dest;
			target = dest->iov_base;
			space  = dest->iov_len;
			continue;
		}
		if (left  < copy) copy = left;
		if (space < copy) copy = space;
		
		memcpy(target, source, copy);
		
		source += copy;
		left   -= copy;
		
		target += copy;
		space  -= copy;
		
		total += copy;
		len   -= copy;
	}
	return total;
}